

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  undefined8 *puVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  undefined3 uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  size_t sVar9;
  long lVar10;
  ulong _pos;
  char cVar11;
  string remainder;
  string wrappableChars;
  size_t local_f8;
  long local_f0;
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  string local_c8;
  Text *local_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  TextAttributes *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_60 = &(this->str).field_2;
  (this->str)._M_dataplus._M_p = (pointer)local_60;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  sVar9 = _attr->indent;
  sVar5 = _attr->width;
  uVar3 = *(undefined4 *)((long)&_attr->width + 4);
  cVar11 = _attr->tabChar;
  uVar6 = *(undefined3 *)&_attr->field_0x19;
  uVar4 = *(undefined4 *)&_attr->field_0x1c;
  (this->attr).initialIndent = _attr->initialIndent;
  (this->attr).indent = sVar9;
  *(int *)&(this->attr).width = (int)sVar5;
  *(undefined4 *)((long)&(this->attr).width + 4) = uVar3;
  (this->attr).tabChar = cVar11;
  *(undefined3 *)&(this->attr).field_0x19 = uVar6;
  *(undefined4 *)&(this->attr).field_0x1c = uVar4;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50[0] = local_40;
  local_a8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50," [({.,/|\\-","");
  local_f8 = _attr->initialIndent;
  if (local_f8 == 0xffffffffffffffff) {
    local_f8 = _attr->indent;
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar2 = (_str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + _str->_M_string_length);
  if (local_c8._M_string_length != 0) {
    local_58 = _attr;
    do {
      if (31999 < (ulong)((long)(this->lines).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->lines).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)) {
        __assert_fail("lines.size() < 1000",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jjh13[P]sisl/test/../include/catch/catch.hpp"
                      ,0x18f8,"Catch::Text::Text(const std::string &, const TextAttributes &)");
      }
      _pos = _attr->width - local_f8;
      if (local_c8._M_string_length <= _pos) {
        _pos = local_c8._M_string_length;
      }
      cVar11 = (char)&local_c8;
      uVar7 = std::__cxx11::string::find(cVar11,10);
      if (uVar7 < _pos) {
        _pos = uVar7;
      }
      local_f0 = std::__cxx11::string::rfind(cVar11,(ulong)(uint)(int)_attr->tabChar);
      if (local_f0 == -1) {
        local_f0 = -1;
      }
      else {
        cVar11 = local_c8._M_dataplus._M_p[_pos];
        std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_c8);
        std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_c8);
        uVar7 = 0xf;
        if (local_80 != local_70) {
          uVar7 = local_70[0];
        }
        if (uVar7 < (ulong)(local_98 + local_78)) {
          uVar7 = 0xf;
          if (local_a0 != local_90) {
            uVar7 = local_90[0];
          }
          if (uVar7 < (ulong)(local_98 + local_78)) goto LAB_0012c942;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_80);
        }
        else {
LAB_0012c942:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0);
        }
        puVar1 = puVar8 + 2;
        if ((undefined8 *)*puVar8 == puVar1) {
          local_d8 = *puVar1;
          uStack_d0 = puVar8[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *puVar1;
          local_e8 = (undefined8 *)*puVar8;
        }
        local_e0 = puVar8[1];
        *puVar8 = puVar1;
        puVar8[1] = 0;
        *(undefined1 *)puVar1 = 0;
        std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_e8);
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
        }
        if (local_a0 != local_90) {
          operator_delete(local_a0);
        }
        if (local_80 != local_70) {
          operator_delete(local_80);
        }
        _pos = _pos - (cVar11 == '\n');
        this = local_a8;
        _attr = local_58;
      }
      if (_pos == local_c8._M_string_length) {
        spliceLine(this,local_f8,&local_c8,_pos);
      }
      else if (local_c8._M_dataplus._M_p[_pos] == '\n') {
        spliceLine(this,local_f8,&local_c8,_pos);
        if ((_pos < 2) || (local_c8._M_string_length != 1)) {
          std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_c8);
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_e8);
          if (local_e8 != &local_d8) {
            operator_delete(local_e8);
          }
        }
        local_f8 = _attr->indent;
      }
      else {
        sVar9 = std::__cxx11::string::find_last_of((char *)&local_c8,(ulong)local_50[0],_pos);
        if (sVar9 - 1 < 0xfffffffffffffffe) {
          spliceLine(this,local_f8,&local_c8,sVar9);
          if (*local_c8._M_dataplus._M_p == ' ') {
            std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_c8);
            std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_e8);
            if (local_e8 != &local_d8) {
              operator_delete(local_e8);
            }
          }
        }
        else {
          spliceLine(this,local_f8,&local_c8,_pos - 1);
          std::__cxx11::string::append
                    ((char *)((this->lines).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1));
        }
        if ((long)(this->lines).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->lines).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x20) {
          local_f8 = _attr->indent;
        }
        lVar10 = 0;
        if (local_f0 != -1) {
          lVar10 = local_f0;
        }
        local_f8 = local_f8 + lVar10;
      }
    } while (local_c8._M_string_length != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

Text::Text( std::string const& _str, TextAttributes const& _attr )
    : attr( _attr )
    {
        std::string wrappableChars = " [({.,/|\\-";
        std::size_t indent = _attr.initialIndent != std::string::npos
            ? _attr.initialIndent
            : _attr.indent;
        std::string remainder = _str;

        while( !remainder.empty() ) {
            assert( lines.size() < 1000 );
            std::size_t tabPos = std::string::npos;
            std::size_t width = (std::min)( remainder.size(), _attr.width - indent );
            std::size_t pos = remainder.find_first_of( '\n' );
            if( pos <= width ) {
                width = pos;
            }
            pos = remainder.find_last_of( _attr.tabChar, width );
            if( pos != std::string::npos ) {
                tabPos = pos;
                if( remainder[width] == '\n' )
                    width--;
                remainder = remainder.substr( 0, tabPos ) + remainder.substr( tabPos+1 );
            }

            if( width == remainder.size() ) {
                spliceLine( indent, remainder, width );
            }
            else if( remainder[width] == '\n' ) {
                spliceLine( indent, remainder, width );
                if( width <= 1 || remainder.size() != 1 )
                    remainder = remainder.substr( 1 );
                indent = _attr.indent;
            }
            else {
                pos = remainder.find_last_of( wrappableChars, width );
                if( pos != std::string::npos && pos > 0 ) {
                    spliceLine( indent, remainder, pos );
                    if( remainder[0] == ' ' )
                        remainder = remainder.substr( 1 );
                }
                else {
                    spliceLine( indent, remainder, width-1 );
                    lines.back() += "-";
                }
                if( lines.size() == 1 )
                    indent = _attr.indent;
                if( tabPos != std::string::npos )
                    indent += tabPos;
            }
        }
    }